

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

rf_image *
rf_gen_image_cellular
          (rf_image *__return_storage_ptr__,int width,int height,int tile_size,rf_rand_proc rand,
          rf_allocator allocator)

{
  rf_source_location rVar1;
  undefined1 auVar2 [24];
  int iVar3;
  int iVar4;
  rf_image local_78;
  undefined8 local_60;
  long local_58;
  undefined4 local_50;
  uint uStack_4c;
  char *local_48;
  char *local_40;
  undefined8 local_38;
  rf_color *local_30;
  rf_color *dst;
  rf_rand_proc p_Stack_20;
  int dst_size;
  rf_rand_proc rand_local;
  int local_10;
  int tile_size_local;
  int height_local;
  int width_local;
  
  p_Stack_20 = rand;
  rand_local._4_4_ = tile_size;
  local_10 = height;
  tile_size_local = width;
  memset(__return_storage_ptr__,0,0x18);
  iVar3 = tile_size_local * local_10;
  iVar4 = rf_bytes_per_pixel(RF_UNCOMPRESSED_R8G8B8A8);
  dst._4_4_ = iVar3 * iVar4;
  local_48 = 
  "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  local_40 = "rf_gen_image_cellular";
  local_38 = 0x430a;
  local_60 = 0;
  local_58 = (long)dst._4_4_;
  local_50 = 0;
  rVar1.proc_name = "rf_gen_image_cellular";
  rVar1.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar1.line_in_file = 0x430a;
  auVar2._8_8_ = (ulong)uStack_4c << 0x20;
  auVar2._0_8_ = local_58;
  auVar2._16_8_ = 0;
  local_30 = (rf_color *)
             (*allocator.allocator_proc)
                       (&allocator,rVar1,RF_AM_ALLOC,(rf_allocator_args)(auVar2 << 0x40));
  if (local_30 != (rf_color *)0x0) {
    rf_gen_image_cellular_to_buffer
              (&local_78,tile_size_local,local_10,rand_local._4_4_,p_Stack_20,local_30,
               (long)dst._4_4_);
    __return_storage_ptr__->data = local_78.data;
    __return_storage_ptr__->width = local_78.width;
    __return_storage_ptr__->height = local_78.height;
    __return_storage_ptr__->format = local_78.format;
    __return_storage_ptr__->valid = local_78.valid;
    *(undefined3 *)&__return_storage_ptr__->field_0x15 = local_78._21_3_;
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_image rf_gen_image_cellular(int width, int height, int tile_size, rf_rand_proc rand, rf_allocator allocator)
{
    rf_image result = {0};

    int dst_size = width * height * rf_bytes_per_pixel(RF_UNCOMPRESSED_R8G8B8A8);

    rf_color* dst = RF_ALLOC(allocator, dst_size);

    if (dst)
    {
        result = rf_gen_image_cellular_to_buffer(width, height, tile_size, rand, dst, dst_size);
    }

    return result;
}